

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.hpp
# Opt level: O0

Image4u * eos::render::render(Image4u *__return_storage_ptr__,Mesh *mesh,Matrix4f *model_view_matrix
                             ,Matrix4f *projection_matrix,int viewport_width,int viewport_height,
                             Texture *texture,bool enable_backface_culling,bool enable_near_clipping
                             ,bool enable_far_clipping)

{
  optional<eos::render::Texture> local_100;
  undefined1 local_d8 [8];
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>
  software_renderer;
  bool enable_far_clipping_local;
  bool enable_near_clipping_local;
  bool enable_backface_culling_local;
  int viewport_height_local;
  int viewport_width_local;
  Matrix4f *projection_matrix_local;
  Matrix4f *model_view_matrix_local;
  Mesh *mesh_local;
  
  software_renderer._151_1_ = enable_backface_culling;
  software_renderer._150_1_ = enable_near_clipping;
  software_renderer._149_1_ = enable_far_clipping;
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>::
  SoftwareRenderer((SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>
                    *)local_d8,viewport_width,viewport_height);
  software_renderer.texture.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
  super__Optional_payload_base<eos::render::Texture>._M_engaged =
       (bool)(software_renderer._151_1_ & 1);
  software_renderer.texture.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
  super__Optional_payload_base<eos::render::Texture>._33_1_ = software_renderer._150_1_ & 1;
  software_renderer._43_1_ = software_renderer._149_1_ & 1;
  std::optional<eos::render::Texture>::optional<eos::render::Texture_&,_true>(&local_100,texture);
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>::render<float>
            (__return_storage_ptr__,
             (SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader> *)
             local_d8,mesh,model_view_matrix,projection_matrix,&local_100);
  std::optional<eos::render::Texture>::~optional(&local_100);
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>::
  ~SoftwareRenderer((SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>
                     *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

core::Image4u render(const core::Mesh& mesh, const Eigen::Matrix4f& model_view_matrix,
                     const Eigen::Matrix4f& projection_matrix, int viewport_width, int viewport_height,
                     Texture texture, bool enable_backface_culling = false, bool enable_near_clipping = true,
                     bool enable_far_clipping = true)
{
    SoftwareRenderer<VertexShader, TexturingFragmentShader> software_renderer(viewport_width,
                                                                              viewport_height);
    software_renderer.enable_backface_culling = enable_backface_culling;
    software_renderer.enable_near_clipping = enable_near_clipping;
    software_renderer.rasterizer.enable_far_clipping = enable_far_clipping;

    return software_renderer.render(mesh, model_view_matrix, projection_matrix, texture);
}